

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_empty_space.cpp
# Opt level: O3

Screen_mask * cppurses::detail::find_empty_space(Screen_mask *__return_storage_ptr__,Widget *w)

{
  pointer puVar1;
  Widget *pWVar2;
  _Bit_type *p_Var3;
  ulong *puVar4;
  const_iterator __begin1;
  size_t sVar5;
  size_t sVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  ulong *puVar10;
  ulong uVar11;
  const_iterator __end1;
  ulong uVar12;
  anon_class_8_1_a8d81ce6 widths_equal;
  long lVar13;
  size_t sVar14;
  ulong uVar15;
  ulong uVar16;
  
  puVar1 = (w->children).children_.
           super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar13 = 0;
  puVar9 = (w->children).children_.
           super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (puVar8 = puVar9; puVar8 != puVar1; puVar8 = puVar8 + 1) {
    pWVar2 = (puVar8->_M_t).
             super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
             super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
             super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
    if (pWVar2->enabled_ == true) {
      lVar13 = lVar13 + pWVar2->outer_height_;
    }
  }
  sVar14 = w->outer_height_;
  sVar5 = Border_offset::north(w);
  sVar6 = Border_offset::south(w);
  if (lVar13 == sVar14 - (sVar6 + sVar5)) {
    sVar14 = w->outer_width_;
    sVar5 = Border_offset::east(w);
    sVar6 = Border_offset::west(w);
    sVar14 = sVar14 - (sVar6 + sVar5);
    uVar12 = (long)puVar1 - (long)puVar9;
    puVar8 = puVar9;
    if (0 < (long)uVar12 >> 5) {
      puVar7 = (pointer)((long)&(puVar9->_M_t).
                                super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                                .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl +
                        (uVar12 & 0xffffffffffffffe0));
      lVar13 = ((long)uVar12 >> 5) + 1;
      puVar8 = puVar9 + 2;
      do {
        pWVar2 = puVar8[-2]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) {
          puVar8 = puVar8 + -2;
          goto LAB_00150704;
        }
        pWVar2 = puVar8[-1]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) {
          puVar8 = puVar8 + -1;
          goto LAB_00150704;
        }
        pWVar2 = (puVar8->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) goto LAB_00150704;
        pWVar2 = puVar8[1]._M_t.
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) {
          puVar8 = puVar8 + 1;
          goto LAB_00150704;
        }
        lVar13 = lVar13 + -1;
        puVar8 = puVar8 + 4;
      } while (1 < lVar13);
      uVar12 = (long)puVar1 - (long)puVar7;
      puVar8 = puVar7;
    }
    lVar13 = (long)uVar12 >> 3;
    if (lVar13 == 1) {
LAB_001506d3:
      pWVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if ((pWVar2->enabled_ == true) && (pWVar2->outer_width_ != sVar14)) goto LAB_00150704;
    }
    else {
      if (lVar13 == 2) {
LAB_001506ba:
        pWVar2 = (puVar8->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ != true) || (pWVar2->outer_width_ == sVar14)) {
          puVar8 = puVar8 + 1;
          goto LAB_001506d3;
        }
      }
      else {
        if (lVar13 != 3) goto LAB_001509dd;
        pWVar2 = (puVar8->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ != true) || (pWVar2->outer_width_ == sVar14)) {
          puVar8 = puVar8 + 1;
          goto LAB_001506ba;
        }
      }
LAB_00150704:
      if (puVar8 != puVar1) goto LAB_0015070d;
    }
LAB_001509dd:
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined8 *)
     &(__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
    (__return_storage_ptr__->area_).width = 0;
    (__return_storage_ptr__->area_).height = 0;
    (__return_storage_ptr__->offset_).x = 0;
    (__return_storage_ptr__->offset_).y = 0;
    (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  }
  else {
LAB_0015070d:
    lVar13 = 0;
    for (puVar8 = puVar9; puVar8 != puVar1; puVar8 = puVar8 + 1) {
      pWVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if (pWVar2->enabled_ == true) {
        lVar13 = lVar13 + pWVar2->outer_width_;
      }
    }
    sVar14 = w->outer_width_;
    sVar5 = Border_offset::east(w);
    sVar6 = Border_offset::west(w);
    if (lVar13 == sVar14 - (sVar6 + sVar5)) {
      sVar14 = w->outer_height_;
      sVar5 = Border_offset::north(w);
      sVar6 = Border_offset::south(w);
      sVar14 = sVar14 - (sVar6 + sVar5);
      uVar12 = (long)puVar1 - (long)puVar9;
      if (0 < (long)uVar12 >> 5) {
        puVar8 = (pointer)((long)&(puVar9->_M_t).
                                  super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                                  .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl +
                          (uVar12 & 0xffffffffffffffe0));
        lVar13 = ((long)uVar12 >> 5) + 1;
        puVar9 = puVar9 + 2;
        do {
          pWVar2 = puVar9[-2]._M_t.
                   super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                   .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
          if ((pWVar2->enabled_ == true) && (pWVar2->outer_height_ != sVar14)) {
            puVar9 = puVar9 + -2;
            goto LAB_001508ae;
          }
          pWVar2 = puVar9[-1]._M_t.
                   super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                   .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
          if ((pWVar2->enabled_ == true) && (pWVar2->outer_height_ != sVar14)) {
            puVar9 = puVar9 + -1;
            goto LAB_001508ae;
          }
          pWVar2 = (puVar9->_M_t).
                   super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                   .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
          if ((pWVar2->enabled_ == true) && (pWVar2->outer_height_ != sVar14)) goto LAB_001508ae;
          pWVar2 = puVar9[1]._M_t.
                   super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>
                   .super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
          if ((pWVar2->enabled_ == true) && (pWVar2->outer_height_ != sVar14)) {
            puVar9 = puVar9 + 1;
            goto LAB_001508ae;
          }
          lVar13 = lVar13 + -1;
          puVar9 = puVar9 + 4;
        } while (1 < lVar13);
        uVar12 = (long)puVar1 - (long)puVar8;
        puVar9 = puVar8;
      }
      lVar13 = (long)uVar12 >> 3;
      if (lVar13 == 1) {
LAB_0015087d:
        pWVar2 = (puVar9->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ != true) || (pWVar2->outer_height_ == sVar14)) goto LAB_001509dd;
      }
      else if (lVar13 == 2) {
LAB_00150864:
        pWVar2 = (puVar9->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ != true) || (pWVar2->outer_height_ == sVar14)) {
          puVar9 = puVar9 + 1;
          goto LAB_0015087d;
        }
      }
      else {
        if (lVar13 != 3) goto LAB_001509dd;
        pWVar2 = (puVar9->_M_t).
                 super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
                 super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
        if ((pWVar2->enabled_ != true) || (pWVar2->outer_height_ == sVar14)) {
          puVar9 = puVar9 + 1;
          goto LAB_00150864;
        }
      }
LAB_001508ae:
      if (puVar9 == puVar1) goto LAB_001509dd;
    }
    Screen_mask::Screen_mask(__return_storage_ptr__,w,Inner);
    puVar1 = (w->children).children_.
             super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar9 = (w->children).children_.
                  super__Vector_base<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>,_std::allocator<std::unique_ptr<cppurses::Widget,_std::default_delete<cppurses::Widget>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1)
    {
      pWVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<cppurses::Widget,_std::default_delete<cppurses::Widget>_>._M_t.
               super__Tuple_impl<0UL,_cppurses::Widget_*,_std::default_delete<cppurses::Widget>_>.
               super__Head_base<0UL,_cppurses::Widget_*,_false>._M_head_impl;
      if (pWVar2->enabled_ == true) {
        uVar12 = (pWVar2->top_left_position_).y;
        sVar14 = pWVar2->outer_height_;
        if (uVar12 < sVar14 + uVar12) {
          p_Var3 = (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
          sVar5 = (pWVar2->top_left_position_).x;
          sVar6 = pWVar2->outer_width_;
          uVar15 = uVar12;
          do {
            uVar16 = sVar5;
            if (sVar5 < sVar5 + sVar6) {
              do {
                lVar13 = (uVar15 - (__return_storage_ptr__->offset_).y) *
                         (__return_storage_ptr__->area_).width - (__return_storage_ptr__->offset_).x
                ;
                uVar11 = uVar16 + lVar13;
                uVar12 = uVar16 + 0x3f + lVar13;
                if (-1 < (long)uVar11) {
                  uVar12 = uVar11;
                }
                puVar10 = p_Var3 + ((long)uVar12 >> 6) +
                                   (ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) +
                                   0xffffffffffffffff;
                *puVar10 = *puVar10 | 1L << ((byte)uVar11 & 0x3f);
                uVar16 = uVar16 + 1;
                sVar5 = (pWVar2->top_left_position_).x;
                sVar6 = pWVar2->outer_width_;
              } while (uVar16 < sVar6 + sVar5);
              uVar12 = (pWVar2->top_left_position_).y;
              sVar14 = pWVar2->outer_height_;
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 < uVar12 + sVar14);
        }
      }
    }
    puVar4 = (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage;
    for (puVar10 = (__return_storage_ptr__->bits_).super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        puVar10 != puVar4; puVar10 = puVar10 + 1) {
      *puVar10 = ~*puVar10;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Screen_mask find_empty_space(const Widget& w) {
    if (children_completely_cover(w)) {
        return Screen_mask{};
    }
    auto mask = Screen_mask{w, Screen_mask::Inner};
    mark_covered_tiles(w, mask);
    mask.flip();
    return mask;
}